

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_dump_MH_index(opj_j2k_v2_t *p_j2k,FILE *out_stream)

{
  uint uVar1;
  undefined8 *puVar2;
  FILE *in_RSI;
  long in_RDI;
  OPJ_UINT32 nb_of_tile_part;
  OPJ_UINT32 it_tile_part;
  OPJ_UINT32 it_tile;
  OPJ_UINT32 it_marker;
  opj_codestream_index_t *cstr_index;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  puVar2 = *(undefined8 **)(in_RDI + 0x110);
  fprintf(in_RSI,"Codestream index from main header: {\n");
  fprintf(in_RSI,"\t Main header start position=%lld\n\t Main header end position=%lld\n",*puVar2,
          puVar2[1]);
  fprintf(in_RSI,"\t Marker list: {\n");
  if (puVar2[4] != 0) {
    for (local_1c = 0; local_1c < *(uint *)(puVar2 + 3); local_1c = local_1c + 1) {
      fprintf(in_RSI,"\t\t type=%#x, pos=%lld, len=%d\n",
              (ulong)*(ushort *)(puVar2[4] + (ulong)local_1c * 0x18),
              *(undefined8 *)(puVar2[4] + (ulong)local_1c * 0x18 + 8),
              (ulong)*(uint *)(puVar2[4] + (ulong)local_1c * 0x18 + 0x10));
    }
  }
  fprintf(in_RSI,"\t }\n");
  if (puVar2[6] != 0) {
    fprintf(in_RSI,"\t Tile index: {\n");
    for (local_20 = 0; local_20 < *(uint *)((long)puVar2 + 0x2c); local_20 = local_20 + 1) {
      uVar1 = *(uint *)(puVar2[6] + (ulong)local_20 * 0x38 + 4);
      fprintf(in_RSI,"\t\t nb of tile-part in tile [%d]=%d\n",(ulong)local_20,(ulong)uVar1);
      if (*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x10) != 0) {
        for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
          fprintf(in_RSI,"\t\t\t tile-part[%d]: star_pos=%lld, end_header=%lld, end_pos=%lld.\n",
                  (ulong)local_24,
                  *(undefined8 *)
                   (*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x10) + (ulong)local_24 * 0x18),
                  *(undefined8 *)
                   (*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x10) + (ulong)local_24 * 0x18 +
                   8),*(undefined8 *)
                       (*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x10) +
                        (ulong)local_24 * 0x18 + 0x10));
        }
      }
      if (*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x20) != 0) {
        for (local_1c = 0; local_1c < *(uint *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x18);
            local_1c = local_1c + 1) {
          fprintf(in_RSI,"\t\t type=%#x, pos=%lld, len=%d\n",
                  (ulong)*(ushort *)
                          (*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x20) +
                          (ulong)local_1c * 0x18),
                  *(undefined8 *)
                   (*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x20) + (ulong)local_1c * 0x18 +
                   8),(ulong)*(uint *)(*(long *)(puVar2[6] + (ulong)local_20 * 0x38 + 0x20) +
                                       (ulong)local_1c * 0x18 + 0x10));
        }
      }
    }
    fprintf(in_RSI,"\t }\n");
  }
  fprintf(in_RSI,"}\n");
  return;
}

Assistant:

void j2k_dump_MH_index(opj_j2k_v2_t* p_j2k, FILE* out_stream)
{
	opj_codestream_index_t* cstr_index = p_j2k->cstr_index;
	OPJ_UINT32 it_marker, it_tile, it_tile_part;

	fprintf(out_stream, "Codestream index from main header: {\n");

	fprintf(out_stream, "\t Main header start position=%" OPJ_OFF_F "d\n"
			            "\t Main header end position=%" OPJ_OFF_F "d\n",
			cstr_index->main_head_start, cstr_index->main_head_end);

	fprintf(out_stream, "\t Marker list: {\n");

	if (cstr_index->marker){
		for (it_marker=0; it_marker < cstr_index->marknum ; it_marker++){
			fprintf(out_stream, "\t\t type=%#x, pos=%" OPJ_OFF_F "d, len=%d\n",
					cstr_index->marker[it_marker].type,
					cstr_index->marker[it_marker].pos,
					cstr_index->marker[it_marker].len );
		}
	}

	fprintf(out_stream, "\t }\n");


	if (cstr_index->tile_index){
		fprintf(out_stream, "\t Tile index: {\n");

		for (it_tile=0; it_tile < cstr_index->nb_of_tiles ; it_tile++){
			OPJ_UINT32 nb_of_tile_part = cstr_index->tile_index[it_tile].nb_tps;

			fprintf(out_stream, "\t\t nb of tile-part in tile [%d]=%d\n", it_tile, nb_of_tile_part);

			if (cstr_index->tile_index[it_tile].tp_index){
				for (it_tile_part =0; it_tile_part < nb_of_tile_part; it_tile_part++){
					fprintf(out_stream, "\t\t\t tile-part[%d]: star_pos=%" OPJ_OFF_F "d, end_header=%" OPJ_OFF_F "d, end_pos=%" OPJ_OFF_F "d.\n",
							it_tile_part,
							cstr_index->tile_index[it_tile].tp_index[it_tile_part].start_pos,
							cstr_index->tile_index[it_tile].tp_index[it_tile_part].end_header,
							cstr_index->tile_index[it_tile].tp_index[it_tile_part].end_pos);
				}
			}

			if (cstr_index->tile_index[it_tile].marker){
				for (it_marker=0; it_marker < cstr_index->tile_index[it_tile].marknum ; it_marker++){
					fprintf(out_stream, "\t\t type=%#x, pos=%" OPJ_OFF_F "d, len=%d\n",
							cstr_index->tile_index[it_tile].marker[it_marker].type,
							cstr_index->tile_index[it_tile].marker[it_marker].pos,
							cstr_index->tile_index[it_tile].marker[it_marker].len );
				}
			}
		}
		fprintf(out_stream,"\t }\n");
	}

	fprintf(out_stream,"}\n");

}